

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMDocumentImpl::createRange(DOMDocumentImpl *this)

{
  createRange((DOMDocumentImpl *)&this[-1].fChanges);
  return;
}

Assistant:

DOMRange* DOMDocumentImpl::createRange()
{

    DOMRangeImpl* range = new (this) DOMRangeImpl(this, fMemoryManager);

    if (fRanges == 0L) {
        //fRanges = new (this) Ranges(1, false);
        fRanges = new (fMemoryManager) Ranges(1, false, fMemoryManager); // XMemory
    }
    fRanges->addElement(range);
    return range;
}